

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fade.cpp
# Opt level: O1

void __thiscall Fade::~Fade(Fade *this)

{
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *pvVar1;
  pointer ppVar2;
  void *pvVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  long lVar5;
  ulong uVar6;
  
  (this->super_Engine)._vptr_Engine = (_func_int **)&PTR__Fade_00144c30;
  pvVar1 = this->_ids;
  if (pvVar1 != (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)0x0) {
    ppVar2 = pvVar1[-1].
             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    if (ppVar2 != (pointer)0x0) {
      lVar5 = (long)ppVar2 * 0x18;
      do {
        pvVar3 = *(void **)((long)&pvVar1[-1].
                                   super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + lVar5);
        if (pvVar3 != (void *)0x0) {
          operator_delete(pvVar3);
        }
        lVar5 = lVar5 + -0x18;
      } while (lVar5 != 0);
    }
    operator_delete__(&pvVar1[-1].
                       super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  if (dfdb::params::NUM_OF_ATTRIBUTES != 0) {
    uVar6 = 0;
    do {
      if (this->_aggregateRegister[uVar6] != (int *)0x0) {
        operator_delete__(this->_aggregateRegister[uVar6]);
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 < dfdb::params::NUM_OF_ATTRIBUTES);
  }
  if (this->_aggregateRegister != (int **)0x0) {
    operator_delete__(this->_aggregateRegister);
  }
  std::
  _Hashtable<std::vector<double,_std::allocator<double>_>,_std::pair<const_std::vector<double,_std::allocator<double>_>,_fade::CacheAggregates>,_std::allocator<std::pair<const_std::vector<double,_std::allocator<double>_>,_fade::CacheAggregates>_>,_std::__detail::_Select1st,_std::equal_to<std::vector<double,_std::allocator<double>_>_>,_std::hash<std::vector<double,_std::allocator<double>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&(this->_caches)._M_h);
  p_Var4 = (this->_dataHandler).super___shared_ptr<DataHandler,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  p_Var4 = (this->_dTree).super___shared_ptr<DTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
    return;
  }
  return;
}

Assistant:

Fade::~Fade()
{
    delete[] _ids;

    for (size_t i = 0; i < NUM_OF_ATTRIBUTES; ++i)
        delete[] _aggregateRegister[i];
    delete[] _aggregateRegister;
}